

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

PolicyStatus __thiscall cmMakefile::GetPolicyStatusInternal(cmMakefile *this,PolicyID id)

{
  cmLocalGenerator *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  __normal_iterator<const_cmMakefile::PolicyStackEntry_*,_std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>_>
  __tmp;
  pointer this_00;
  
  do {
    this_00 = (this->PolicyStack).
              super__Vector_base<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    while (this_00 !=
           (this->PolicyStack).
           super__Vector_base<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_start) {
      this_00 = this_00 + -1;
      bVar2 = cmPolicies::PolicyMap::IsDefined(&this_00->super_PolicyMap,id);
      if (bVar2) {
        PVar3 = cmPolicies::PolicyMap::Get(&this_00->super_PolicyMap,id);
        return PVar3;
      }
    }
    pcVar1 = this->LocalGenerator->Parent;
    if (pcVar1 == (cmLocalGenerator *)0x0) {
      PVar3 = cmPolicies::GetPolicyStatus(id);
      return PVar3;
    }
    this = pcVar1->Makefile;
  } while( true );
}

Assistant:

cmPolicies::PolicyStatus
cmMakefile::GetPolicyStatusInternal(cmPolicies::PolicyID id) const
{
  // Is the policy set in our stack?
  for(PolicyStackType::const_reverse_iterator psi = this->PolicyStack.rbegin();
      psi != this->PolicyStack.rend(); ++psi)
    {
    if(psi->IsDefined(id))
      {
      return psi->Get(id);
      }
    }

  // If we have a parent directory, recurse up to it.
  if(this->LocalGenerator->GetParent())
    {
    cmMakefile* parent = this->LocalGenerator->GetParent()->GetMakefile();
    return parent->GetPolicyStatusInternal(id);
    }

  // The policy is not set.  Use the default for this CMake version.
  return cmPolicies::GetPolicyStatus(id);
}